

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>::
insert<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Entry,kj::Path&>
          (HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
           *this,ArrayPtr<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>
                 table,size_t pos,Path *params)

{
  size_t *psVar1;
  undefined8 *puVar2;
  size_t sVar3;
  String *pSVar4;
  uchar *puVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uchar *puVar10;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar11;
  uint uVar12;
  long lVar13;
  Entry *this_00;
  ulong targetSize;
  uchar *puVar14;
  ArrayPtr<const_kj::String> *in_R9;
  Disposer *pDVar15;
  HashBucket *pHVar16;
  HashBucket *s;
  HashBucket *pHVar17;
  ArrayPtr<const_unsigned_char> s_00;
  Maybe<unsigned_long> MVar18;
  PathPtr local_40;
  
  this_00 = table.ptr;
  uVar6 = (long)(this_00->value).dir.disposer * 2;
  if (uVar6 < ((this_00->key).parts.size_ + pos) * 3 + 3) {
    targetSize = pos * 2 + 2;
    if (targetSize < uVar6) {
      targetSize = uVar6;
    }
    HashIndex<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>::
    rehash((HashIndex<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
            *)this_00,targetSize);
  }
  sVar3 = in_R9->size_;
  uVar12 = (int)sVar3 * 4;
  if (sVar3 != 0) {
    pSVar4 = in_R9->ptr;
    lVar13 = 0;
    do {
      puVar5 = *(uchar **)((long)&(pSVar4->content).size_ + lVar13);
      puVar14 = puVar5;
      if (puVar5 != (uchar *)0x0) {
        puVar14 = *(uchar **)((long)&(pSVar4->content).ptr + lVar13);
      }
      puVar10 = (uchar *)0x0;
      if (puVar5 != (uchar *)0x0) {
        puVar10 = puVar5 + -1;
      }
      s_00.size_ = (size_t)puVar10;
      s_00.ptr = puVar14;
      uVar8 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s_00);
      uVar12 = uVar12 * 0x5bd1e995 ^ (uVar8 * 0x5bd1e995 >> 0x18 ^ uVar8 * 0x5bd1e995) * 0x5bd1e995;
      lVar13 = lVar13 + 0x18;
    } while (sVar3 * 0x18 != lVar13);
  }
  uVar9 = kj::_::chooseBucket((uint)(uVar12 != 0),*(uint *)&(this_00->value).dir.disposer);
  pHVar17 = (HashBucket *)0x0;
  aVar11 = extraout_RDX;
  do {
    pHVar16 = ((Array<kj::_::HashBucket> *)&(this_00->key).parts.disposer)->ptr + uVar9;
    uVar8 = pHVar16->value;
    if (uVar8 == 1) {
      if (pHVar17 == (HashBucket *)0x0) {
        pHVar17 = pHVar16;
      }
    }
    else {
      if (uVar8 == 0) {
        if (pHVar17 != (HashBucket *)0x0) {
          psVar1 = &(this_00->key).parts.size_;
          *psVar1 = *psVar1 - 1;
          pHVar16 = pHVar17;
        }
        *pHVar16 = (HashBucket)(((ulong)(uVar12 != 0) | (long)params << 0x20) + 0x200000000);
        *this = (HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
                 )0x0;
        goto LAB_001942f9;
      }
      if (pHVar16->hash == (uint)(uVar12 != 0)) {
        puVar2 = (undefined8 *)(table.size_ + (ulong)(uVar8 - 2) * 0x30);
        local_40.parts.ptr = (String *)*puVar2;
        local_40.parts.size_ = puVar2[1];
        bVar7 = PathPtr::operator==(&local_40,(PathPtr)*in_R9);
        aVar11 = extraout_RDX_00;
        if (bVar7) {
          uVar8 = pHVar16->value;
          *this = (HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
                   )0x1;
          *(ulong *)(this + 8) = (ulong)(uVar8 - 2);
LAB_001942f9:
          MVar18.ptr.field_1.value = aVar11.value;
          MVar18.ptr._0_8_ = this;
          return (Maybe<unsigned_long>)MVar18.ptr;
        }
      }
    }
    pDVar15 = (Disposer *)((ulong)uVar9 + 1);
    uVar9 = 0;
    if (pDVar15 != (this_00->value).dir.disposer) {
      uVar9 = (uint)pDVar15;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash.
      rehash(kj::max(buckets.size() * 2, (table.size() + 1) * 2));
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_MAYBE(s, erasedSlot) {
          --erasedCount;
          *s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return nullptr;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == nullptr) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }